

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdefaultrt.hpp
# Opt level: O1

int __thiscall
soplex::
SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeave(SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,
             number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *param_2,bool param_3)

{
  bool bVar1;
  uint uVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  long lVar5;
  undefined8 uVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  uint *puVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  undefined4 *puVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  cpp_dec_float<200U,_int,_void> *pcVar18;
  undefined4 *puVar19;
  long lVar20;
  long in_FS_OFFSET;
  byte bVar21;
  Real a;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  uint local_304;
  undefined1 local_2e8 [32];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [13];
  undefined3 uStack_27b;
  int iStack_278;
  bool bStack_274;
  undefined8 local_270;
  cpp_dec_float<200U,_int,_void> *local_268;
  long local_260;
  undefined1 local_258 [32];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [13];
  undefined3 uStack_1eb;
  int iStack_1e8;
  bool bStack_1e4;
  undefined8 local_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [13];
  undefined3 uStack_16b;
  int iStack_168;
  bool bStack_164;
  undefined8 local_160;
  undefined1 local_158 [32];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [13];
  undefined3 uStack_eb;
  int iStack_e8;
  bool bStack_e4;
  undefined8 local_e0;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [13];
  undefined3 uStack_4b;
  int iStack_48;
  bool bStack_44;
  undefined8 local_40;
  
  bVar21 = 0;
  iVar7 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])();
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var,iVar7) + 0xfe8) + 0x98));
  iVar7 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar11 = **(long **)(CONCAT44(extraout_var_00,iVar7) + 0xfe8);
  iVar7 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar10 = *(long *)(*(long *)(CONCAT44(extraout_var_01,iVar7) + 0xfe8) + 0xb8);
  iVar7 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar9 = *(long *)(CONCAT44(extraout_var_02,iVar7) + 0xfe8);
  iVar7 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar5 = *(long *)(CONCAT44(extraout_var_03,iVar7) + 0xfb0);
  iVar7 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  local_260 = *(long *)(CONCAT44(extraout_var_04,iVar7) + 0xfc8);
  local_268 = (cpp_dec_float<200U,_int,_void> *)this;
  iVar7 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  a = Tolerances::epsilon(*(Tolerances **)(CONCAT44(extraout_var_05,iVar7) + 0x228));
  local_40._0_4_ = cpp_dec_float_finite;
  local_40._4_4_ = 0x1c;
  local_b8._0_16_ = (undefined1  [16])0x0;
  local_b8._16_16_ = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_58 = SUB1613((undefined1  [16])0x0,0);
  uStack_4b = 0;
  iStack_48 = 0;
  bStack_44 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_b8,a);
  local_e0._0_4_ = cpp_dec_float_finite;
  local_e0._4_4_ = 0x1c;
  local_158._0_16_ = (undefined1  [16])0x0;
  local_158._16_16_ = (undefined1  [16])0x0;
  local_138 = (undefined1  [16])0x0;
  local_128 = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_f8 = SUB1613((undefined1  [16])0x0,0);
  uStack_eb = 0;
  iStack_e8 = 0;
  bStack_e4 = false;
  if ((val->m_backend).fpclass != cpp_dec_float_NaN) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<200U,_int,_void> *)local_2e8,0,(type *)0x0);
    iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&val->m_backend,(cpp_dec_float<200U,_int,_void> *)local_2e8);
    if (0 < iVar7) {
      if (*(int *)(lVar9 + 0xa0) < 1) {
        local_304 = 0xffffffff;
      }
      else {
        local_268 = (cpp_dec_float<200U,_int,_void> *)((local_268->data)._M_elems + 7);
        local_c8 = *(double *)(in_FS_OFFSET + -8);
        uStack_c0 = 0;
        local_d8 = -*(double *)(in_FS_OFFSET + -8);
        uStack_d0 = 0x8000000000000000;
        local_304 = 0xffffffff;
        lVar20 = 0;
        do {
          uVar2 = *(uint *)(*(long *)(lVar9 + 0xa8) + lVar20 * 4);
          lVar12 = (long)(int)uVar2 * 0x80;
          puVar14 = (uint *)(lVar10 + lVar12);
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_158;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            (pcVar15->data)._M_elems[0] = *puVar14;
            puVar14 = puVar14 + (ulong)bVar21 * -2 + 1;
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar21 * -8 + 4);
          }
          iStack_e8 = *(int *)(lVar10 + 0x70 + lVar12);
          bStack_e4 = (bool)*(undefined1 *)(lVar10 + 0x74 + lVar12);
          uVar6 = *(undefined8 *)(lVar10 + 0x78 + lVar12);
          local_e0._0_4_ = (fpclass_type)uVar6;
          local_e0._4_4_ = SUB84(uVar6,4);
          if ((((fpclass_type)uVar6 == cpp_dec_float_NaN) ||
              ((fpclass_type)local_40 == cpp_dec_float_NaN)) ||
             (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_158,
                                 (cpp_dec_float<200U,_int,_void> *)local_b8), iVar7 < 1)) {
            puVar16 = (undefined4 *)local_b8;
            puVar19 = (undefined4 *)local_2e8;
            for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
              *puVar19 = *puVar16;
              puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
              puVar19 = puVar19 + (ulong)bVar21 * -2 + 1;
            }
            iStack_278 = iStack_48;
            bStack_274 = bStack_44;
            local_270._0_4_ = (fpclass_type)local_40;
            local_270._4_4_ = local_40._4_4_;
            if (local_2e8._0_4_ != 0 || (fpclass_type)local_40 != cpp_dec_float_finite) {
              bStack_274 = (bool)(bStack_44 ^ 1);
            }
            if ((((fpclass_type)local_40 != cpp_dec_float_NaN) &&
                ((fpclass_type)local_e0 != cpp_dec_float_NaN)) &&
               (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  ((cpp_dec_float<200U,_int,_void> *)local_158,
                                   (cpp_dec_float<200U,_int,_void> *)local_2e8), iVar7 < 0)) {
              ::soplex::infinity::__tls_init();
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)(local_260 + lVar12);
              local_270._0_4_ = cpp_dec_float_finite;
              local_270._4_4_ = 0x1c;
              local_2e8._0_16_ = (undefined1  [16])0x0;
              local_2e8._16_16_ = (undefined1  [16])0x0;
              local_2c8 = (undefined1  [16])0x0;
              local_2b8 = (undefined1  [16])0x0;
              local_2a8 = (undefined1  [16])0x0;
              local_298 = (undefined1  [16])0x0;
              local_288 = SUB1613((undefined1  [16])0x0,0);
              uStack_27b = 0;
              iStack_278 = 0;
              bStack_274 = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)local_2e8,local_d8);
              if (((pcVar15->fpclass != cpp_dec_float_NaN) &&
                  ((fpclass_type)local_270 != cpp_dec_float_NaN)) &&
                 (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    (pcVar15,(cpp_dec_float<200U,_int,_void> *)local_2e8), 0 < iVar7
                 )) {
                local_1e0._0_4_ = cpp_dec_float_finite;
                local_1e0._4_4_ = 0x1c;
                local_258._0_16_ = (undefined1  [16])0x0;
                local_258._16_16_ = (undefined1  [16])0x0;
                local_238 = (undefined1  [16])0x0;
                local_228 = (undefined1  [16])0x0;
                local_218 = (undefined1  [16])0x0;
                local_208 = (undefined1  [16])0x0;
                local_1f8 = SUB1613((undefined1  [16])0x0,0);
                uStack_1eb = 0;
                iStack_1e8 = 0;
                bStack_1e4 = false;
                if ((cpp_dec_float<200U,_int,_void> *)local_258 ==
                    (cpp_dec_float<200U,_int,_void> *)(lVar12 + lVar11)) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_258,pcVar15);
                  if (local_258._0_4_ != 0 || (fpclass_type)local_1e0 != cpp_dec_float_finite) {
                    bStack_1e4 = (bool)(bStack_1e4 ^ 1);
                  }
                }
                else {
                  if ((cpp_dec_float<200U,_int,_void> *)local_258 != pcVar15) {
                    pcVar13 = pcVar15;
                    pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_258;
                    for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
                      (pcVar18->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
                      pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar13 + (ulong)bVar21 * -8 + 4);
                      pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar18 + (ulong)bVar21 * -8 + 4);
                    }
                    iStack_1e8 = pcVar15->exp;
                    bStack_1e4 = pcVar15->neg;
                    local_1e0._0_4_ = pcVar15->fpclass;
                    local_1e0._4_4_ = pcVar15->prec_elem;
                  }
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_258,
                             (cpp_dec_float<200U,_int,_void> *)(lVar12 + lVar11));
                }
                local_160._0_4_ = cpp_dec_float_finite;
                local_160._4_4_ = 0x1c;
                local_1d8 = (undefined1  [16])0x0;
                local_1c8 = (undefined1  [16])0x0;
                local_1b8 = (undefined1  [16])0x0;
                local_1a8 = (undefined1  [16])0x0;
                local_198 = (undefined1  [16])0x0;
                local_188 = (undefined1  [16])0x0;
                local_178 = SUB1613((undefined1  [16])0x0,0);
                uStack_16b = 0;
                iStack_168 = 0;
                bStack_164 = false;
                if ((cpp_dec_float<200U,_int,_void> *)local_1d8 == local_268) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_1d8,
                             (cpp_dec_float<200U,_int,_void> *)local_258);
                  if (local_1d8._0_4_ != 0 || (fpclass_type)local_160 != cpp_dec_float_finite) {
                    bStack_164 = (bool)(bStack_164 ^ 1);
                  }
                }
                else {
                  puVar14 = (uint *)local_258;
                  pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_1d8;
                  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
                    (pcVar15->data)._M_elems[0] = *puVar14;
                    puVar14 = puVar14 + (ulong)bVar21 * -2 + 1;
                    pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar15 + (ulong)bVar21 * -8 + 4);
                  }
                  iStack_168 = iStack_1e8;
                  bStack_164 = bStack_1e4;
                  local_160._0_4_ = (fpclass_type)local_1e0;
                  local_160._4_4_ = local_1e0._4_4_;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_1d8,local_268);
                }
                goto LAB_005b8f38;
              }
            }
          }
          else {
            ::soplex::infinity::__tls_init();
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)(lVar5 + lVar12);
            local_270._0_4_ = cpp_dec_float_finite;
            local_270._4_4_ = 0x1c;
            local_2e8._0_16_ = (undefined1  [16])0x0;
            local_2e8._16_16_ = (undefined1  [16])0x0;
            local_2c8 = (undefined1  [16])0x0;
            local_2b8 = (undefined1  [16])0x0;
            local_2a8 = (undefined1  [16])0x0;
            local_298 = (undefined1  [16])0x0;
            local_288 = SUB1613((undefined1  [16])0x0,0);
            uStack_27b = 0;
            iStack_278 = 0;
            bStack_274 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_2e8,local_c8);
            if (((pcVar15->fpclass != cpp_dec_float_NaN) &&
                ((fpclass_type)local_270 != cpp_dec_float_NaN)) &&
               (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (pcVar15,(cpp_dec_float<200U,_int,_void> *)local_2e8), iVar7 < 0))
            {
              local_1e0._0_4_ = cpp_dec_float_finite;
              local_1e0._4_4_ = 0x1c;
              local_258._0_16_ = (undefined1  [16])0x0;
              local_258._16_16_ = (undefined1  [16])0x0;
              local_238 = (undefined1  [16])0x0;
              local_228 = (undefined1  [16])0x0;
              local_218 = (undefined1  [16])0x0;
              local_208 = (undefined1  [16])0x0;
              local_1f8 = SUB1613((undefined1  [16])0x0,0);
              uStack_1eb = 0;
              iStack_1e8 = 0;
              bStack_1e4 = false;
              if ((cpp_dec_float<200U,_int,_void> *)local_258 ==
                  (cpp_dec_float<200U,_int,_void> *)(lVar12 + lVar11)) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_258,pcVar15);
                if (local_258._0_4_ != 0 || (fpclass_type)local_1e0 != cpp_dec_float_finite) {
                  bStack_1e4 = (bool)(bStack_1e4 ^ 1);
                }
              }
              else {
                if ((cpp_dec_float<200U,_int,_void> *)local_258 != pcVar15) {
                  pcVar13 = pcVar15;
                  pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_258;
                  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
                    (pcVar18->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
                    pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar13 + (ulong)bVar21 * -8 + 4);
                    pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar18 + (ulong)bVar21 * -8 + 4);
                  }
                  iStack_1e8 = pcVar15->exp;
                  bStack_1e4 = pcVar15->neg;
                  local_1e0._0_4_ = pcVar15->fpclass;
                  local_1e0._4_4_ = pcVar15->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_258,
                           (cpp_dec_float<200U,_int,_void> *)(lVar12 + lVar11));
              }
              local_160._0_4_ = cpp_dec_float_finite;
              local_160._4_4_ = 0x1c;
              local_1d8 = (undefined1  [16])0x0;
              local_1c8 = (undefined1  [16])0x0;
              local_1b8 = (undefined1  [16])0x0;
              local_1a8 = (undefined1  [16])0x0;
              local_198 = (undefined1  [16])0x0;
              local_188 = (undefined1  [16])0x0;
              local_178 = SUB1613((undefined1  [16])0x0,0);
              uStack_16b = 0;
              iStack_168 = 0;
              bStack_164 = false;
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_258;
              if ((cpp_dec_float<200U,_int,_void> *)local_1d8 != local_268) {
                pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_1d8;
                for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
                  (pcVar13->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
                  pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar15 + (ulong)bVar21 * -8 + 4);
                  pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar13 + (ulong)bVar21 * -8 + 4);
                }
                iStack_168 = iStack_1e8;
                bStack_164 = bStack_1e4;
                local_160._0_4_ = (fpclass_type)local_1e0;
                local_160._4_4_ = local_1e0._4_4_;
                pcVar15 = local_268;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_1d8,pcVar15);
LAB_005b8f38:
              local_270._0_4_ = cpp_dec_float_finite;
              local_270._4_4_ = 0x1c;
              local_2e8._0_16_ = (undefined1  [16])0x0;
              local_2e8._16_16_ = (undefined1  [16])0x0;
              local_2c8 = (undefined1  [16])0x0;
              local_2b8 = (undefined1  [16])0x0;
              local_2a8 = (undefined1  [16])0x0;
              local_298 = (undefined1  [16])0x0;
              local_288 = SUB1613((undefined1  [16])0x0,0);
              uStack_27b = 0;
              iStack_278 = 0;
              bStack_274 = false;
              boost::multiprecision::default_ops::
              eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        ((cpp_dec_float<200U,_int,_void> *)local_2e8,
                         (cpp_dec_float<200U,_int,_void> *)local_1d8,
                         (cpp_dec_float<200U,_int,_void> *)local_158);
              if ((((fpclass_type)local_270 != cpp_dec_float_NaN) &&
                  ((val->m_backend).fpclass != cpp_dec_float_NaN)) &&
                 (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)local_2e8,&val->m_backend),
                 iVar7 < 0)) {
                puVar14 = (uint *)local_2e8;
                pnVar17 = val;
                for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
                  (pnVar17->m_backend).data._M_elems[0] = *puVar14;
                  puVar14 = puVar14 + (ulong)bVar21 * -2 + 1;
                  pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
                }
                (val->m_backend).exp = iStack_278;
                (val->m_backend).neg = bStack_274;
                (val->m_backend).fpclass = (fpclass_type)local_270;
                (val->m_backend).prec_elem = local_270._4_4_;
                local_304 = uVar2;
              }
            }
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 < *(int *)(lVar9 + 0xa0));
      }
      if ((int)local_304 < 0) {
        return local_304;
      }
      lVar20 = (ulong)local_304 * 0x80;
      puVar16 = (undefined4 *)(lVar10 + lVar20);
      puVar19 = (undefined4 *)local_158;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar19 = *puVar16;
        puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
        puVar19 = puVar19 + (ulong)bVar21 * -2 + 1;
      }
      iStack_e8 = *(int *)(lVar10 + 0x70 + lVar20);
      bStack_e4 = (bool)*(undefined1 *)(lVar10 + 0x74 + lVar20);
      uVar6 = *(undefined8 *)(lVar10 + 0x78 + lVar20);
      local_e0._0_4_ = (fpclass_type)uVar6;
      local_e0._4_4_ = SUB84(uVar6,4);
      lVar9 = local_260;
      if ((((fpclass_type)uVar6 != cpp_dec_float_NaN) &&
          ((fpclass_type)local_40 != cpp_dec_float_NaN)) &&
         ((iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)local_158,
                              (cpp_dec_float<200U,_int,_void> *)local_b8), lVar9 = local_260,
          0 < iVar7 &&
          (((*(int *)(lVar11 + 0x78 + lVar20) != 2 && (*(int *)(lVar5 + 0x78 + lVar20) != 2)) &&
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)(lVar11 + lVar20),
                               (cpp_dec_float<200U,_int,_void> *)(lVar5 + lVar20)), -1 < iVar7))))))
      goto LAB_005b9b9b;
      puVar16 = (undefined4 *)local_b8;
      puVar19 = (undefined4 *)local_2e8;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar19 = *puVar16;
        puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
        puVar19 = puVar19 + (ulong)bVar21 * -2 + 1;
      }
      iStack_278 = iStack_48;
      bStack_274 = bStack_44;
      local_270._0_4_ = (fpclass_type)local_40;
      local_270._4_4_ = local_40._4_4_;
      if (local_2e8._0_4_ != 0 || (fpclass_type)local_40 != cpp_dec_float_finite) {
        bStack_274 = (bool)(bStack_44 ^ 1);
      }
      if ((((fpclass_type)local_40 != cpp_dec_float_NaN) &&
          ((fpclass_type)local_e0 != cpp_dec_float_NaN)) &&
         (((iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_158,
                               (cpp_dec_float<200U,_int,_void> *)local_2e8), iVar7 < 0 &&
           ((*(int *)(lVar11 + 0x78 + lVar20) != 2 && (*(int *)(lVar9 + 0x78 + lVar20) != 2)))) &&
          (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)(lVar11 + lVar20),
                              (cpp_dec_float<200U,_int,_void> *)(lVar9 + lVar20)), iVar7 < 1))))
      goto LAB_005b9b9b;
      if ((((fpclass_type)local_e0 != cpp_dec_float_NaN) &&
          ((fpclass_type)local_40 != cpp_dec_float_NaN)) &&
         (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_158,
                             (cpp_dec_float<200U,_int,_void> *)local_b8), 0 < iVar7)) {
        lVar9 = lVar5;
      }
      goto LAB_005b99ec;
    }
  }
  if (*(int *)(lVar9 + 0xa0) < 1) {
    local_304 = 0xffffffff;
  }
  else {
    local_268 = (cpp_dec_float<200U,_int,_void> *)((local_268->data)._M_elems + 7);
    local_d8 = *(double *)(in_FS_OFFSET + -8);
    uStack_d0 = 0;
    local_c8 = -*(double *)(in_FS_OFFSET + -8);
    uStack_c0 = 0x8000000000000000;
    local_304 = 0xffffffff;
    lVar20 = 0;
    do {
      uVar2 = *(uint *)(*(long *)(lVar9 + 0xa8) + lVar20 * 4);
      lVar12 = (long)(int)uVar2 * 0x80;
      puVar14 = (uint *)(lVar10 + lVar12);
      pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_158;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pcVar15->data)._M_elems[0] = *puVar14;
        puVar14 = puVar14 + (ulong)bVar21 * -2 + 1;
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar21 * -8 + 4);
      }
      iStack_e8 = *(int *)(lVar10 + 0x70 + lVar12);
      bStack_e4 = (bool)*(undefined1 *)(lVar10 + 0x74 + lVar12);
      uVar6 = *(undefined8 *)(lVar10 + 0x78 + lVar12);
      local_e0._0_4_ = (fpclass_type)uVar6;
      local_e0._4_4_ = SUB84(uVar6,4);
      puVar16 = (undefined4 *)local_b8;
      puVar19 = (undefined4 *)local_2e8;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        *puVar19 = *puVar16;
        puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
        puVar19 = puVar19 + (ulong)bVar21 * -2 + 1;
      }
      iStack_278 = iStack_48;
      bStack_274 = bStack_44;
      local_270._0_4_ = (fpclass_type)local_40;
      local_270._4_4_ = local_40._4_4_;
      if (local_2e8._0_4_ != 0 || (fpclass_type)local_40 != cpp_dec_float_finite) {
        bStack_274 = (bool)(bStack_44 ^ 1);
      }
      if (((fpclass_type)local_40 == cpp_dec_float_NaN || (fpclass_type)uVar6 == cpp_dec_float_NaN)
         || (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_158,
                                (cpp_dec_float<200U,_int,_void> *)local_2e8), -1 < iVar7)) {
        if (((fpclass_type)local_e0 != cpp_dec_float_NaN) &&
           (((fpclass_type)local_40 != cpp_dec_float_NaN &&
            (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_158,
                                (cpp_dec_float<200U,_int,_void> *)local_b8), 0 < iVar7)))) {
          ::soplex::infinity::__tls_init();
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)(local_260 + lVar12);
          local_270._0_4_ = cpp_dec_float_finite;
          local_270._4_4_ = 0x1c;
          local_2e8._0_16_ = (undefined1  [16])0x0;
          local_2e8._16_16_ = (undefined1  [16])0x0;
          local_2c8 = (undefined1  [16])0x0;
          local_2b8 = (undefined1  [16])0x0;
          local_2a8 = (undefined1  [16])0x0;
          local_298 = (undefined1  [16])0x0;
          local_288 = SUB1613((undefined1  [16])0x0,0);
          uStack_27b = 0;
          iStack_278 = 0;
          bStack_274 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_2e8,local_c8);
          if ((pcVar15->fpclass != cpp_dec_float_NaN) &&
             (((fpclass_type)local_270 != cpp_dec_float_NaN &&
              (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (pcVar15,(cpp_dec_float<200U,_int,_void> *)local_2e8), 0 < iVar7)))
             ) {
            local_1e0._0_4_ = cpp_dec_float_finite;
            local_1e0._4_4_ = 0x1c;
            local_258._0_16_ = (undefined1  [16])0x0;
            local_258._16_16_ = (undefined1  [16])0x0;
            local_238 = (undefined1  [16])0x0;
            local_228 = (undefined1  [16])0x0;
            local_218 = (undefined1  [16])0x0;
            local_208 = (undefined1  [16])0x0;
            local_1f8 = SUB1613((undefined1  [16])0x0,0);
            uStack_1eb = 0;
            iStack_1e8 = 0;
            bStack_1e4 = false;
            if ((cpp_dec_float<200U,_int,_void> *)local_258 ==
                (cpp_dec_float<200U,_int,_void> *)(lVar12 + lVar11)) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_258,pcVar15);
              if (local_258._0_4_ != 0 || (fpclass_type)local_1e0 != cpp_dec_float_finite) {
                bStack_1e4 = (bool)(bStack_1e4 ^ 1);
              }
            }
            else {
              if ((cpp_dec_float<200U,_int,_void> *)local_258 != pcVar15) {
                pcVar13 = pcVar15;
                pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_258;
                for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
                  (pcVar18->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
                  pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar13 + (ulong)bVar21 * -8 + 4);
                  pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar18 + (ulong)bVar21 * -8 + 4);
                }
                iStack_1e8 = pcVar15->exp;
                bStack_1e4 = pcVar15->neg;
                local_1e0._0_4_ = pcVar15->fpclass;
                local_1e0._4_4_ = pcVar15->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_258,
                         (cpp_dec_float<200U,_int,_void> *)(lVar12 + lVar11));
            }
            local_160._0_4_ = cpp_dec_float_finite;
            local_160._4_4_ = 0x1c;
            local_1d8 = (undefined1  [16])0x0;
            local_1c8 = (undefined1  [16])0x0;
            local_1b8 = (undefined1  [16])0x0;
            local_1a8 = (undefined1  [16])0x0;
            local_198 = (undefined1  [16])0x0;
            local_188 = (undefined1  [16])0x0;
            local_178 = SUB1613((undefined1  [16])0x0,0);
            uStack_16b = 0;
            iStack_168 = 0;
            bStack_164 = false;
            if ((cpp_dec_float<200U,_int,_void> *)local_1d8 == local_268) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_1d8,
                         (cpp_dec_float<200U,_int,_void> *)local_258);
              if (local_1d8._0_4_ != 0 || (fpclass_type)local_160 != cpp_dec_float_finite) {
                bStack_164 = (bool)(bStack_164 ^ 1);
              }
            }
            else {
              puVar14 = (uint *)local_258;
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_1d8;
              for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
                (pcVar15->data)._M_elems[0] = *puVar14;
                puVar14 = puVar14 + (ulong)bVar21 * -2 + 1;
                pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar21 * -8 + 4)
                ;
              }
              iStack_168 = iStack_1e8;
              bStack_164 = bStack_1e4;
              local_160._0_4_ = (fpclass_type)local_1e0;
              local_160._4_4_ = local_1e0._4_4_;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_1d8,local_268);
            }
            goto LAB_005b965c;
          }
        }
      }
      else {
        ::soplex::infinity::__tls_init();
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)(lVar5 + lVar12);
        local_270._0_4_ = cpp_dec_float_finite;
        local_270._4_4_ = 0x1c;
        local_2e8._0_16_ = (undefined1  [16])0x0;
        local_2e8._16_16_ = (undefined1  [16])0x0;
        local_2c8 = (undefined1  [16])0x0;
        local_2b8 = (undefined1  [16])0x0;
        local_2a8 = (undefined1  [16])0x0;
        local_298 = (undefined1  [16])0x0;
        local_288 = SUB1613((undefined1  [16])0x0,0);
        uStack_27b = 0;
        iStack_278 = 0;
        bStack_274 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_2e8,local_d8);
        if (((pcVar15->fpclass != cpp_dec_float_NaN) &&
            ((fpclass_type)local_270 != cpp_dec_float_NaN)) &&
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (pcVar15,(cpp_dec_float<200U,_int,_void> *)local_2e8), iVar7 < 0)) {
          local_1e0._0_4_ = cpp_dec_float_finite;
          local_1e0._4_4_ = 0x1c;
          local_258._0_16_ = (undefined1  [16])0x0;
          local_258._16_16_ = (undefined1  [16])0x0;
          local_238 = (undefined1  [16])0x0;
          local_228 = (undefined1  [16])0x0;
          local_218 = (undefined1  [16])0x0;
          local_208 = (undefined1  [16])0x0;
          local_1f8 = SUB1613((undefined1  [16])0x0,0);
          uStack_1eb = 0;
          iStack_1e8 = 0;
          bStack_1e4 = false;
          if ((cpp_dec_float<200U,_int,_void> *)local_258 ==
              (cpp_dec_float<200U,_int,_void> *)(lVar12 + lVar11)) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_258,pcVar15);
            if (local_258._0_4_ != 0 || (fpclass_type)local_1e0 != cpp_dec_float_finite) {
              bStack_1e4 = (bool)(bStack_1e4 ^ 1);
            }
          }
          else {
            if ((cpp_dec_float<200U,_int,_void> *)local_258 != pcVar15) {
              pcVar13 = pcVar15;
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_258;
              for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
                (pcVar18->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
                pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4)
                ;
                pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar21 * -8 + 4)
                ;
              }
              iStack_1e8 = pcVar15->exp;
              bStack_1e4 = pcVar15->neg;
              local_1e0._0_4_ = pcVar15->fpclass;
              local_1e0._4_4_ = pcVar15->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_258,
                       (cpp_dec_float<200U,_int,_void> *)(lVar12 + lVar11));
          }
          local_160._0_4_ = cpp_dec_float_finite;
          local_160._4_4_ = 0x1c;
          local_1d8 = (undefined1  [16])0x0;
          local_1c8 = (undefined1  [16])0x0;
          local_1b8 = (undefined1  [16])0x0;
          local_1a8 = (undefined1  [16])0x0;
          local_198 = (undefined1  [16])0x0;
          local_188 = (undefined1  [16])0x0;
          local_178 = SUB1613((undefined1  [16])0x0,0);
          uStack_16b = 0;
          iStack_168 = 0;
          bStack_164 = false;
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_258;
          if ((cpp_dec_float<200U,_int,_void> *)local_1d8 != local_268) {
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_1d8;
            for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
              (pcVar13->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar21 * -8 + 4);
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar21 * -8 + 4);
            }
            iStack_168 = iStack_1e8;
            bStack_164 = bStack_1e4;
            local_160._0_4_ = (fpclass_type)local_1e0;
            local_160._4_4_ = local_1e0._4_4_;
            pcVar15 = local_268;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)local_1d8,pcVar15);
LAB_005b965c:
          local_270._0_4_ = cpp_dec_float_finite;
          local_270._4_4_ = 0x1c;
          local_2e8._0_16_ = (undefined1  [16])0x0;
          local_2e8._16_16_ = (undefined1  [16])0x0;
          local_2c8 = (undefined1  [16])0x0;
          local_2b8 = (undefined1  [16])0x0;
          local_2a8 = (undefined1  [16])0x0;
          local_298 = (undefined1  [16])0x0;
          local_288 = SUB1613((undefined1  [16])0x0,0);
          uStack_27b = 0;
          iStack_278 = 0;
          bStack_274 = false;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)local_2e8,
                     (cpp_dec_float<200U,_int,_void> *)local_1d8,
                     (cpp_dec_float<200U,_int,_void> *)local_158);
          if ((((fpclass_type)local_270 != cpp_dec_float_NaN) &&
              ((val->m_backend).fpclass != cpp_dec_float_NaN)) &&
             (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_2e8,&val->m_backend),
             0 < iVar7)) {
            puVar14 = (uint *)local_2e8;
            pnVar17 = val;
            for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
              (pnVar17->m_backend).data._M_elems[0] = *puVar14;
              puVar14 = puVar14 + (ulong)bVar21 * -2 + 1;
              pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
            }
            (val->m_backend).exp = iStack_278;
            (val->m_backend).neg = bStack_274;
            (val->m_backend).fpclass = (fpclass_type)local_270;
            (val->m_backend).prec_elem = local_270._4_4_;
            local_304 = uVar2;
          }
        }
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < *(int *)(lVar9 + 0xa0));
  }
  if ((int)local_304 < 0) {
    return local_304;
  }
  lVar20 = (ulong)local_304 * 0x80;
  puVar16 = (undefined4 *)(lVar10 + lVar20);
  puVar19 = (undefined4 *)local_158;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar19 = *puVar16;
    puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
    puVar19 = puVar19 + (ulong)bVar21 * -2 + 1;
  }
  iStack_e8 = *(int *)(lVar10 + 0x70 + lVar20);
  bStack_e4 = (bool)*(undefined1 *)(lVar10 + 0x74 + lVar20);
  uVar6 = *(undefined8 *)(lVar10 + 0x78 + lVar20);
  local_e0._0_4_ = (fpclass_type)uVar6;
  local_e0._4_4_ = SUB84(uVar6,4);
  puVar16 = (undefined4 *)local_b8;
  puVar19 = (undefined4 *)local_2e8;
  for (lVar10 = 0x1c; lVar9 = local_260, lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar19 = *puVar16;
    puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
    puVar19 = puVar19 + (ulong)bVar21 * -2 + 1;
  }
  iStack_278 = iStack_48;
  bStack_274 = bStack_44;
  local_270._0_4_ = (fpclass_type)local_40;
  local_270._4_4_ = local_40._4_4_;
  if (local_2e8._0_4_ != 0 || (fpclass_type)local_40 != cpp_dec_float_finite) {
    bStack_274 = (bool)(bStack_44 ^ 1);
  }
  if (((((fpclass_type)local_40 != cpp_dec_float_NaN && (fpclass_type)uVar6 != cpp_dec_float_NaN) &&
       (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_158,
                           (cpp_dec_float<200U,_int,_void> *)local_2e8), iVar7 < 0)) &&
      ((*(int *)(lVar11 + 0x78 + lVar20) != 2 &&
       ((*(int *)(lVar5 + 0x78 + lVar20) != 2 &&
        (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)(lVar11 + lVar20),
                            (cpp_dec_float<200U,_int,_void> *)(lVar5 + lVar20)), -1 < iVar7)))))) ||
     (((fpclass_type)local_e0 != cpp_dec_float_NaN &&
      (((((fpclass_type)local_40 != cpp_dec_float_NaN &&
         (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_158,
                             (cpp_dec_float<200U,_int,_void> *)local_b8), 0 < iVar7)) &&
        (*(int *)(lVar11 + 0x78 + lVar20) != 2)) &&
       ((*(int *)(lVar9 + 0x78 + lVar20) != 2 &&
        (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)(lVar11 + lVar20),
                            (cpp_dec_float<200U,_int,_void> *)(lVar9 + lVar20)), iVar7 < 1)))))))) {
LAB_005b9b9b:
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)val,0.0);
    return local_304;
  }
  if (((fpclass_type)local_e0 != cpp_dec_float_NaN) &&
     (((fpclass_type)local_40 != cpp_dec_float_NaN &&
      (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)local_158,
                          (cpp_dec_float<200U,_int,_void> *)local_b8), iVar7 < 0)))) {
    lVar9 = lVar5;
  }
LAB_005b99ec:
  puVar14 = (uint *)(lVar9 + lVar20);
  pnVar17 = val;
  for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pnVar17->m_backend).data._M_elems[0] = *puVar14;
    puVar14 = puVar14 + (ulong)bVar21 * -2 + 1;
    pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
  }
  iVar7 = *(int *)(lVar9 + 0x70 + lVar20);
  (val->m_backend).exp = iVar7;
  bVar1 = *(bool *)(lVar9 + 0x74 + lVar20);
  (val->m_backend).neg = bVar1;
  fVar3 = *(fpclass_type *)(lVar9 + 0x78 + lVar20);
  (val->m_backend).fpclass = fVar3;
  iVar4 = *(int32_t *)(lVar9 + 0x7c + lVar20);
  (val->m_backend).prec_elem = iVar4;
  local_160._0_4_ = cpp_dec_float_finite;
  local_160._4_4_ = 0x1c;
  local_1d8 = (undefined1  [16])0x0;
  local_1c8 = (undefined1  [16])0x0;
  local_1b8 = (undefined1  [16])0x0;
  local_1a8 = (undefined1  [16])0x0;
  local_198 = (undefined1  [16])0x0;
  local_188 = (undefined1  [16])0x0;
  local_178 = SUB1613((undefined1  [16])0x0,0);
  uStack_16b = 0;
  iStack_168 = 0;
  bStack_164 = false;
  if ((cpp_dec_float<200U,_int,_void> *)local_1d8 ==
      (cpp_dec_float<200U,_int,_void> *)(lVar11 + lVar20)) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              ((cpp_dec_float<200U,_int,_void> *)local_1d8,&val->m_backend);
    if (local_1d8._0_4_ != 0 || (fpclass_type)local_160 != cpp_dec_float_finite) {
      bStack_164 = (bool)(bStack_164 ^ 1);
    }
  }
  else {
    if ((cpp_dec_float<200U,_int,_void> *)local_1d8 != &val->m_backend) {
      pnVar17 = val;
      pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_1d8;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (((cpp_dec_float<200U,_int,_void> *)&pcVar15->data)->data)._M_elems[0] =
             (pnVar17->m_backend).data._M_elems[0];
        pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar21 * -8 + 4);
      }
      local_160._4_4_ = iVar4;
      local_160._0_4_ = fVar3;
      iStack_168 = iVar7;
      bStack_164 = bVar1;
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              ((cpp_dec_float<200U,_int,_void> *)local_1d8,
               (cpp_dec_float<200U,_int,_void> *)(lVar11 + lVar20));
  }
  local_270._0_4_ = cpp_dec_float_finite;
  local_270._4_4_ = 0x1c;
  local_2e8._0_16_ = (undefined1  [16])0x0;
  local_2e8._16_16_ = (undefined1  [16])0x0;
  local_2c8 = (undefined1  [16])0x0;
  local_2b8 = (undefined1  [16])0x0;
  local_2a8 = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_288 = SUB1613((undefined1  [16])0x0,0);
  uStack_27b = 0;
  iStack_278 = 0;
  bStack_274 = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_2e8,(cpp_dec_float<200U,_int,_void> *)local_1d8
             ,(cpp_dec_float<200U,_int,_void> *)local_158);
  pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_2e8;
  pnVar17 = val;
  for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pnVar17->m_backend).data._M_elems[0] = (pcVar15->data)._M_elems[0];
    pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar21 * -8 + 4);
    pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
  }
  (val->m_backend).exp = iStack_278;
  (val->m_backend).neg = bStack_274;
  (val->m_backend).fpclass = (fpclass_type)local_270;
  (val->m_backend).prec_elem = local_270._4_4_;
  return local_304;
}

Assistant:

int SPxDefaultRT<R>::selectLeave(R& val, R, bool)
{
   this->solver()->fVec().delta().setup();

   const R*   vec = this->solver()->fVec().get_const_ptr();
   const R*   upd = this->solver()->fVec().delta().values();
   const IdxSet& idx = this->solver()->fVec().idx();
   const R*   ub  = this->solver()->ubBound().get_const_ptr();
   const R*   lb  = this->solver()->lbBound().get_const_ptr();

   R epsilon = this->solver()->epsilon();
   int  leave   = -1;

   R x;
   int  i;
   int  j;

   // PARALLEL the j loop could be parallelized
   if(val > 0)
   {
      // Loop over NZEs of delta vector.
      for(j = 0; j < idx.size(); ++j)
      {
         i = idx.index(j);
         x = upd[i];

         if(x > epsilon)
         {
            if(ub[i] < R(infinity))
            {
               R y = (ub[i] - vec[i] + this->delta) / x;

               if(y < val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lb[i] > R(-infinity))
            {
               R y = (lb[i] - vec[i] - this->delta) / x;

               if(y < val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
      }

      if(leave >= 0)
      {
         x   = upd[leave];

         // BH 2005-11-30: It may well happen that the basis is degenerate and the
         // selected leaving variable is (at most this->delta) beyond its bound. (This
         // happens for instance on LP/netlib/adlittle.mps with setting -r -t0.)
         // In that case we do a pivot step with length zero to avoid difficulties.
         if((x > epsilon  && vec[leave] >= ub[leave]) ||
               (x < -epsilon && vec[leave] <= lb[leave]))
         {
            val = 0.0;
         }
         else
         {
            val = (x > epsilon) ? ub[leave] : lb[leave];
            val = (val - vec[leave]) / x;
         }
      }

      SOPLEX_ASSERT_WARN("WDEFRT01", val > -epsilon);
   }
   else
   {
      for(j = 0; j < idx.size(); ++j)
      {
         i = idx.index(j);
         x = upd[i];

         if(x < -epsilon)
         {
            if(ub[i] < R(infinity))
            {
               R y = (ub[i] - vec[i] + this->delta) / x;

               if(y > val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
         else if(x > epsilon)
         {
            if(lb[i] > R(-infinity))
            {
               R y = (lb[i] - vec[i] - this->delta) / x;

               if(y > val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
      }

      if(leave >= 0)
      {
         x   = upd[leave];

         // See comment above.
         if((x < -epsilon && vec[leave] >= ub[leave]) ||
               (x > epsilon  && vec[leave] <= lb[leave]))
         {
            val = 0.0;
         }
         else
         {
            val = (x < epsilon) ? ub[leave] : lb[leave];
            val = (val - vec[leave]) / x;
         }
      }

      SOPLEX_ASSERT_WARN("WDEFRT02", val < epsilon);
   }

   return leave;
}